

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_ManFindNetworkExact(Ses_Man_t *pSes,int nGates)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  sat_solver *psVar4;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int i;
  uint uVar17;
  ulong uVar18;
  int local_6c;
  int local_68;
  int local_64;
  Vec_Int_t *local_60;
  ulong local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  abctime local_38;
  
  uVar3 = Abc_Clock();
  pSes->vPolar->nSize = 0;
  pSes->vAssump->nSize = 0;
  iVar9 = 0;
  if (pSes->fSatVerbose != 0) {
    printf("create variables for network with %d functions over %d variables and %d/%d gates\n",
           (ulong)(uint)pSes->nSpecFunc,(ulong)(uint)pSes->nSpecVars,(ulong)(uint)nGates,
           (ulong)(uint)pSes->nMaxGates);
  }
  pSes->nGates = nGates;
  pSes->nSimVars = pSes->nRows * nGates;
  iVar7 = pSes->nSpecFunc * nGates;
  pSes->nOutputVars = iVar7;
  pSes->nGateVars = nGates * 3;
  pSes->nSelectVars = 0;
  iVar13 = pSes->nSpecVars;
  iVar14 = iVar13 + nGates;
  for (; iVar13 < iVar14; iVar13 = iVar13 + 1) {
    iVar9 = iVar9 + ((iVar13 + -1) * iVar13) / 2;
    pSes->nSelectVars = iVar9;
  }
  if (pSes->nMaxDepth < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = ((nGates + 1) * nGates) / 2 + pSes->nArrTimeMax * nGates;
  }
  pSes->nDepthVars = iVar13;
  pSes->nDepthOffset = 0;
  pSes->nSelectOffset = iVar13;
  pSes->nGateOffset = iVar9 + iVar13;
  iVar9 = iVar9 + iVar13 + nGates * 3;
  pSes->nOutputOffset = iVar9;
  pSes->nSimOffset = iVar9 + iVar7;
  if (pSes->pSat == (sat_solver *)0x0) {
    psVar4 = sat_solver_new();
    pSes->pSat = psVar4;
  }
  else {
    sat_solver_restart(pSes->pSat);
    psVar4 = pSes->pSat;
  }
  sat_solver_setnvars(psVar4,pSes->nSelectVars + pSes->nOutputVars +
                             pSes->nGateVars + pSes->nSimVars + pSes->nDepthVars);
  if (pSes->nMaxDepth != -1) {
    local_58 = uVar3;
    for (uVar17 = 0; (int)uVar17 < pSes->nGates; uVar17 = uVar17 + 1) {
      for (uVar2 = 1; uVar2 < uVar17; uVar2 = uVar2 + 1) {
        local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,uVar2);
        for (uVar15 = 0; uVar15 != uVar2; uVar15 = uVar15 + 1) {
          iVar9 = Ses_ManSelectVar(pSes,uVar17,pSes->nSpecVars + uVar15,pSes->nSpecVars + uVar2);
          local_6c = Abc_Var2Lit(iVar9,1);
          for (iVar9 = 1; iVar9 + -1 <= (int)(pSes->nArrTimeMax + uVar15); iVar9 = iVar9 + 1) {
            iVar13 = Ses_ManDepthVar(pSes,uVar15,iVar9 + -1);
            local_68 = Abc_Var2Lit(iVar13,1);
            iVar13 = Ses_ManDepthVar(pSes,uVar17,iVar9);
            local_64 = Abc_Var2Lit(iVar13,0);
            sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
          }
          uVar2 = (uint)local_60;
        }
      }
      for (uVar2 = 0; uVar2 != uVar17; uVar2 = uVar2 + 1) {
        iVar9 = 0;
        while (iVar13 = pSes->nSpecVars + uVar2, iVar9 < iVar13) {
          local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,iVar9);
          iVar9 = Ses_ManSelectVar(pSes,uVar17,iVar9,iVar13);
          local_6c = Abc_Var2Lit(iVar9,1);
          for (iVar9 = 1; iVar9 + -1 <= (int)(pSes->nArrTimeMax + uVar2); iVar9 = iVar9 + 1) {
            iVar13 = Ses_ManDepthVar(pSes,uVar2,iVar9 + -1);
            local_68 = Abc_Var2Lit(iVar13,1);
            iVar13 = Ses_ManDepthVar(pSes,uVar17,iVar9);
            local_64 = Abc_Var2Lit(iVar13,0);
            sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
          }
          iVar9 = (uint)local_60 + 1;
        }
      }
      if (pSes->pArrTimeProfile == (int *)0x0) {
        pVVar6 = pSes->vAssump;
        iVar9 = Ses_ManDepthVar(pSes,uVar17,0);
        iVar9 = Abc_Var2Lit(iVar9,0);
        Vec_IntPush(pVVar6,iVar9);
      }
      else {
        iVar9 = pSes->nSpecVars;
        for (lVar8 = 1; lVar8 < (int)(iVar9 + uVar17); lVar8 = lVar8 + 1) {
          lVar16 = 0;
          while( true ) {
            iVar7 = (int)lVar8;
            iVar13 = iVar9;
            if (iVar7 < iVar9) {
              iVar13 = iVar7;
            }
            if (iVar13 <= lVar16) break;
            iVar13 = pSes->pArrTimeProfile[lVar16];
            if ((lVar8 < iVar9) && (iVar9 = pSes->pArrTimeProfile[lVar8], iVar13 < iVar9)) {
              iVar13 = iVar9;
            }
            iVar9 = Ses_ManSelectVar(pSes,uVar17,(int)lVar16,iVar7);
            local_6c = Abc_Var2Lit(iVar9,1);
            iVar9 = Ses_ManDepthVar(pSes,uVar17,iVar13);
            local_68 = Abc_Var2Lit(iVar9,0);
            sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
            lVar16 = lVar16 + 1;
            iVar9 = pSes->nSpecVars;
          }
        }
      }
      for (iVar9 = 1; iVar13 = pSes->nArrTimeMax + uVar17, iVar9 <= iVar13; iVar9 = iVar9 + 1) {
        iVar13 = Ses_ManDepthVar(pSes,uVar17,iVar9);
        local_6c = Abc_Var2Lit(iVar13,1);
        iVar13 = Ses_ManDepthVar(pSes,uVar17,iVar9 + -1);
        local_68 = Abc_Var2Lit(iVar13,0);
        sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
      }
      if (pSes->nMaxDepth < iVar13) {
        iVar9 = 0;
        while (iVar9 < pSes->nSpecFunc) {
          iVar13 = Ses_ManOutputVar(pSes,iVar9,uVar17);
          local_6c = Abc_Var2Lit(iVar13,1);
          iVar13 = Ses_ManDepthVar(pSes,uVar17,pSes->nMaxDepth);
          local_68 = Abc_Var2Lit(iVar13,1);
          iVar13 = sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
          iVar9 = iVar9 + 1;
          if (iVar13 == 0) {
            aVar5 = Abc_Clock();
            pSes->timeInstance = pSes->timeInstance + (aVar5 - local_58);
            goto LAB_00283e00;
          }
        }
      }
    }
    aVar5 = Abc_Clock();
    pSes->timeInstance = pSes->timeInstance + (aVar5 - local_58);
  }
  psVar4 = pSes->pSat;
  piVar1 = pSes->vPolar->pArray;
  uVar17 = pSes->vPolar->nSize;
  for (lVar8 = 0; lVar8 < psVar4->size; lVar8 = lVar8 + 1) {
    psVar4->polarity[lVar8] = '\0';
  }
  uVar12 = 0;
  uVar3 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar3 = uVar12;
  }
  for (; uVar3 != uVar12; uVar12 = uVar12 + 1) {
    psVar4->polarity[piVar1[uVar12]] = '\x01';
  }
  iVar9 = Ses_ManSolve(pSes);
  if (iVar9 == 0) {
LAB_00283e00:
    iVar9 = 2;
  }
  else {
    if (iVar9 != 2) {
      local_38 = Abc_Clock();
      uVar3 = 0;
      while( true ) {
        local_44 = pSes->nRows;
        iVar9 = (int)uVar3;
        if (local_44 <= iVar9) break;
        if (((pSes->pTtValues[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) &&
           (iVar13 = Ses_ManCreateTruthTableClause(pSes,iVar9), iVar13 == 0)) goto LAB_00283de5;
        uVar3 = (ulong)(iVar9 + 1);
      }
      local_40 = uVar3;
      if (pSes->nSpecFunc == 1) {
        iVar9 = 0;
        while( true ) {
          iVar13 = pSes->nGates + -1;
          pVVar6 = pSes->vAssump;
          if (iVar13 <= iVar9) break;
          iVar13 = Ses_ManOutputVar(pSes,0,iVar9);
          iVar13 = Abc_Var2Lit(iVar13,1);
          Vec_IntPush(pVVar6,iVar13);
          iVar9 = iVar9 + 1;
        }
        iVar9 = Ses_ManOutputVar(pSes,0,iVar13);
        iVar9 = Abc_Var2Lit(iVar9,0);
        Vec_IntPush(pVVar6,iVar9);
        local_60 = Vec_IntAlloc(0);
      }
      else {
        local_60 = Vec_IntAlloc(0);
        for (iVar9 = 0; iVar9 < pSes->nSpecFunc; iVar9 = iVar9 + 1) {
          Vec_IntGrowResize(local_60,pSes->nGates);
          for (iVar13 = 0; iVar13 < pSes->nGates; iVar13 = iVar13 + 1) {
            iVar7 = Ses_ManOutputVar(pSes,iVar9,iVar13);
            iVar7 = Abc_Var2Lit(iVar7,0);
            Vec_IntSetEntry(local_60,iVar13,iVar7);
          }
          sat_solver_addclause(pSes->pSat,local_60->pArray,local_60->pArray + pSes->nGates);
        }
      }
      for (iVar9 = 0; iVar13 = pSes->nGates, iVar9 < iVar13; iVar9 = iVar9 + 1) {
        Vec_IntGrowResize(local_60,((pSes->nSpecVars + iVar9 + -1) * (pSes->nSpecVars + iVar9)) / 2)
        ;
        iVar13 = pSes->nSpecVars;
        iVar14 = 0;
        iVar7 = 0;
        while (iVar11 = iVar7, iVar11 < iVar13 + iVar9) {
          for (iVar10 = iVar11 + 1; iVar7 = iVar11 + 1, iVar10 < iVar13 + iVar9; iVar10 = iVar10 + 1
              ) {
            iVar13 = Ses_ManSelectVar(pSes,iVar9,iVar11,iVar10);
            iVar13 = Abc_Var2Lit(iVar13,0);
            Vec_IntSetEntry(local_60,iVar14,iVar13);
            iVar13 = pSes->nSpecVars;
            iVar14 = iVar14 + 1;
          }
        }
        sat_solver_addclause(pSes->pSat,local_60->pArray,local_60->pArray + iVar14);
      }
      if (pSes->fMakeAIG != 0) {
        for (iVar9 = 0; iVar9 < iVar13; iVar9 = iVar9 + 1) {
          iVar13 = Ses_ManGateVar(pSes,iVar9,0,1);
          local_6c = Abc_Var2Lit(iVar13,1);
          iVar13 = Ses_ManGateVar(pSes,iVar9,1,0);
          local_68 = Abc_Var2Lit(iVar13,1);
          iVar13 = Ses_ManGateVar(pSes,iVar9,1,1);
          local_64 = Abc_Var2Lit(iVar13,0);
          sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
          iVar13 = Ses_ManGateVar(pSes,iVar9,0,1);
          local_6c = Abc_Var2Lit(iVar13,1);
          iVar13 = Ses_ManGateVar(pSes,iVar9,1,0);
          local_68 = Abc_Var2Lit(iVar13,0);
          iVar13 = Ses_ManGateVar(pSes,iVar9,1,1);
          local_64 = Abc_Var2Lit(iVar13,1);
          sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
          iVar13 = Ses_ManGateVar(pSes,iVar9,0,1);
          local_6c = Abc_Var2Lit(iVar13,0);
          iVar13 = Ses_ManGateVar(pSes,iVar9,1,0);
          local_68 = Abc_Var2Lit(iVar13,1);
          iVar13 = Ses_ManGateVar(pSes,iVar9,1,1);
          local_64 = Abc_Var2Lit(iVar13,1);
          sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
          iVar13 = pSes->nGates;
        }
      }
      for (iVar9 = 0; iVar9 < iVar13; iVar9 = iVar9 + 1) {
        iVar13 = Ses_ManGateVar(pSes,iVar9,0,1);
        local_6c = Abc_Var2Lit(iVar13,0);
        iVar13 = Ses_ManGateVar(pSes,iVar9,1,0);
        local_68 = Abc_Var2Lit(iVar13,0);
        iVar13 = Ses_ManGateVar(pSes,iVar9,1,1);
        local_64 = Abc_Var2Lit(iVar13,0);
        sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
        iVar13 = Ses_ManGateVar(pSes,iVar9,0,1);
        local_6c = Abc_Var2Lit(iVar13,1);
        iVar13 = Ses_ManGateVar(pSes,iVar9,1,0);
        local_68 = Abc_Var2Lit(iVar13,0);
        iVar13 = Ses_ManGateVar(pSes,iVar9,1,1);
        local_64 = Abc_Var2Lit(iVar13,1);
        sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
        iVar13 = Ses_ManGateVar(pSes,iVar9,0,1);
        local_6c = Abc_Var2Lit(iVar13,0);
        iVar13 = Ses_ManGateVar(pSes,iVar9,1,0);
        local_68 = Abc_Var2Lit(iVar13,1);
        iVar13 = Ses_ManGateVar(pSes,iVar9,1,1);
        local_64 = Abc_Var2Lit(iVar13,1);
        sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
        iVar13 = pSes->nGates;
      }
      for (iVar9 = 0; iVar9 < iVar13; iVar9 = iVar9 + 1) {
        iVar13 = pSes->nSpecVars;
        for (iVar7 = 1; iVar7 < iVar13 + iVar9; iVar7 = iVar7 + 1) {
          for (iVar14 = 0; iVar14 != iVar7; iVar14 = iVar14 + 1) {
            iVar13 = Ses_ManSelectVar(pSes,iVar9,iVar14,iVar7);
            local_6c = Abc_Var2Lit(iVar13,1);
            for (iVar11 = 1; iVar13 = pSes->nSpecVars, iVar11 < iVar13 + iVar9; iVar11 = iVar11 + 1)
            {
              for (iVar13 = 0; iVar11 != iVar13; iVar13 = iVar13 + 1) {
                if (iVar14 != iVar13 || iVar7 != iVar11) {
                  iVar10 = Ses_ManSelectVar(pSes,iVar9,iVar13,iVar11);
                  local_68 = Abc_Var2Lit(iVar10,1);
                  if (local_6c < local_68) {
                    sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
                  }
                }
              }
            }
          }
        }
        iVar13 = pSes->nGates;
      }
      pVVar6 = pSes->vStairDecVars;
      iVar9 = pVVar6->nSize;
      if (iVar9 != 0) {
        iVar13 = -1;
        for (lVar8 = 0; lVar8 < iVar9; lVar8 = lVar8 + 1) {
          iVar7 = Vec_IntEntry(pVVar6,(int)lVar8);
          iVar9 = pSes->nGates;
          if (iVar7 <= iVar13 + iVar9 + -1) {
            pVVar6 = pSes->vAssump;
            iVar7 = Ses_ManSelectVar(pSes,iVar13 + iVar9,iVar7,iVar9 + pSes->nSpecVars + iVar13 + -1
                                    );
            iVar9 = 0;
            iVar7 = Abc_Var2Lit(iVar7,0);
            Vec_IntPush(pVVar6,iVar7);
            uVar17 = pSes->pStairDecFunc[lVar8];
            uVar15 = 1;
            uVar2 = uVar15;
            switch(uVar17) {
            case 1:
              goto switchD_002836c3_caseD_1;
            case 2:
              break;
            case 3:
              uVar2 = 0;
              uVar15 = 0;
              break;
            case 4:
              goto switchD_002836c3_caseD_4;
            case 5:
              pVVar6 = pSes->vAssump;
              uVar2 = 0;
              iVar9 = Ses_ManGateVar(pSes,pSes->nGates + iVar13,0,1);
              iVar9 = Abc_Var2Lit(iVar9,0);
              Vec_IntPush(pVVar6,iVar9);
              break;
            default:
              printf("func: %d\n",(ulong)uVar17);
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,0x569,"int Ses_ManCreateClauses(Ses_Man_t *)");
            }
            pVVar6 = pSes->vAssump;
            iVar9 = 1;
            iVar7 = Ses_ManGateVar(pSes,pSes->nGates + iVar13,1,0);
            iVar7 = Abc_Var2Lit(iVar7,uVar2);
            Vec_IntPush(pVVar6,iVar7);
            uVar17 = uVar15;
switchD_002836c3_caseD_1:
            pVVar6 = pSes->vAssump;
            iVar9 = Ses_ManGateVar(pSes,pSes->nGates + iVar13,iVar9,1);
            iVar9 = Abc_Var2Lit(iVar9,uVar17);
            Vec_IntPush(pVVar6,iVar9);
          }
switchD_002836c3_caseD_4:
          pVVar6 = pSes->vStairDecVars;
          iVar9 = pVVar6->nSize;
          iVar13 = iVar13 + -1;
        }
        iVar13 = pSes->nGates;
      }
      Vec_IntGrowResize(local_60,(iVar13 + pSes->nSpecVars + -2) * iVar13 + pSes->nSpecFunc);
      local_58 = 1;
      iVar9 = 0;
      while (iVar9 < pSes->nGates) {
        for (iVar13 = 0; iVar13 < pSes->nSpecFunc; iVar13 = iVar13 + 1) {
          iVar7 = Ses_ManOutputVar(pSes,iVar13,iVar9);
          iVar7 = Abc_Var2Lit(iVar7,0);
          Vec_IntSetEntry(local_60,iVar13,iVar7);
        }
        iVar7 = iVar9 + 1;
        local_50 = CONCAT44(local_50._4_4_,iVar7);
        for (; iVar7 < pSes->nGates; iVar7 = iVar7 + 1) {
          iVar14 = 0;
          while( true ) {
            iVar11 = pSes->nSpecVars;
            if (iVar11 + iVar9 <= iVar14) break;
            iVar11 = Ses_ManSelectVar(pSes,iVar7,iVar14,iVar11 + iVar9);
            iVar11 = Abc_Var2Lit(iVar11,0);
            Vec_IntSetEntry(local_60,iVar13 + iVar14,iVar11);
            iVar14 = iVar14 + 1;
          }
          iVar13 = iVar13 + iVar14;
          for (iVar10 = (int)local_58 + iVar11; iVar10 < iVar11 + iVar7; iVar10 = iVar10 + 1) {
            iVar14 = Ses_ManSelectVar(pSes,iVar7,iVar11 + iVar9,iVar10);
            iVar14 = Abc_Var2Lit(iVar14,0);
            Vec_IntSetEntry(local_60,iVar13,iVar14);
            iVar11 = pSes->nSpecVars;
            iVar13 = iVar13 + 1;
          }
        }
        sat_solver_addclause(pSes->pSat,local_60->pArray,local_60->pArray + iVar13);
        local_58 = (ulong)((int)local_58 + 1);
        iVar9 = (int)local_50;
      }
      Vec_IntFree(local_60);
      iVar9 = pSes->nGates;
      if (1 < iVar9) {
        pVVar6 = (Vec_Int_t *)0x0;
        while ((int)pVVar6 < iVar9 + -1) {
          iVar13 = (int)pVVar6 + 1;
          local_50 = CONCAT44(local_50._4_4_,iVar13);
          local_60 = pVVar6;
          while (iVar13 < iVar9) {
            local_58 = CONCAT44(local_58._4_4_,iVar13);
            for (iVar9 = 1; iVar9 < pSes->nSpecVars + (int)pVVar6; iVar9 = iVar9 + 1) {
              for (iVar13 = 0; iVar9 != iVar13; iVar13 = iVar13 + 1) {
                iVar11 = (int)local_60;
                iVar7 = Ses_ManSelectVar(pSes,iVar11,iVar13,iVar9);
                local_6c = Abc_Var2Lit(iVar7,1);
                iVar7 = (int)local_58;
                iVar14 = Ses_ManSelectVar(pSes,(int)local_58,iVar13,pSes->nSpecVars + iVar11);
                local_68 = Abc_Var2Lit(iVar14,1);
                sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
                iVar7 = Ses_ManSelectVar(pSes,iVar7,iVar9,pSes->nSpecVars + iVar11);
                local_68 = Abc_Var2Lit(iVar7,1);
                sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
              }
              pVVar6 = local_60;
            }
            iVar9 = pSes->nGates;
            iVar13 = (int)local_58 + 1;
          }
          pVVar6 = (Vec_Int_t *)(local_50 & 0xffffffff);
        }
        if (2 < iVar9) {
          iVar13 = 0;
          while (iVar13 < iVar9 + -2) {
            local_58 = CONCAT44(local_58._4_4_,iVar13 + 1);
            iVar7 = iVar13 + 1;
            while (iVar7 < iVar9 + -1) {
              iVar14 = iVar7 + 1;
              local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,iVar14);
              for (; iVar14 < iVar9; iVar14 = iVar14 + 1) {
                for (iVar9 = 1; iVar9 < pSes->nSpecVars + iVar13; iVar9 = iVar9 + 1) {
                  for (iVar11 = 0; iVar9 != iVar11; iVar11 = iVar11 + 1) {
                    iVar10 = Ses_ManSelectVar(pSes,iVar13,iVar11,iVar9);
                    local_6c = Abc_Var2Lit(iVar10,1);
                    iVar10 = Ses_ManSelectVar(pSes,iVar7,iVar11,iVar9);
                    local_68 = Abc_Var2Lit(iVar10,1);
                    iVar10 = Ses_ManSelectVar(pSes,iVar14,iVar13,iVar7);
                    local_64 = Abc_Var2Lit(iVar10,1);
                    sat_solver_addclause(pSes->pSat,&local_6c,(lit *)&local_60);
                  }
                }
                iVar9 = pSes->nGates;
              }
              iVar7 = (uint)local_60;
            }
            iVar13 = (int)local_58;
          }
        }
      }
      iVar13 = 0;
      while (iVar13 < iVar9 + -1) {
        local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,iVar13 + 1);
        for (iVar9 = 2; iVar9 < pSes->nSpecVars + iVar13; iVar9 = iVar9 + 1) {
          for (iVar7 = 1; iVar7 != iVar9; iVar7 = iVar7 + 1) {
            for (iVar14 = 0; iVar7 != iVar14; iVar14 = iVar14 + 1) {
              iVar11 = Ses_ManSelectVar(pSes,iVar13,iVar7,iVar9);
              local_6c = Abc_Var2Lit(iVar11,1);
              iVar11 = Ses_ManSelectVar(pSes,(uint)local_60,iVar14,iVar9);
              local_68 = Abc_Var2Lit(iVar11,1);
              sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
            }
          }
          for (iVar7 = 0; iVar7 != iVar9; iVar7 = iVar7 + 1) {
            for (iVar14 = 1; iVar14 != iVar9; iVar14 = iVar14 + 1) {
              for (iVar11 = 0; iVar14 != iVar11; iVar11 = iVar11 + 1) {
                iVar10 = Ses_ManSelectVar(pSes,iVar13,iVar7,iVar9);
                local_6c = Abc_Var2Lit(iVar10,1);
                iVar10 = Ses_ManSelectVar(pSes,(uint)local_60,iVar11,iVar14);
                local_68 = Abc_Var2Lit(iVar10,1);
                sat_solver_addclause(pSes->pSat,&local_6c,&local_64);
              }
            }
          }
        }
        iVar9 = pSes->nGates;
        iVar13 = (uint)local_60;
      }
      uVar3 = local_40;
      if (pSes->nSpecFunc == 1) {
        for (uVar12 = 1; uVar3 = local_40, (long)uVar12 < (long)pSes->nSpecVars; uVar12 = uVar12 + 1
            ) {
          local_50 = uVar12;
          for (uVar3 = 0; uVar3 != uVar12; uVar3 = uVar3 + 1) {
            iVar9 = Extra_TruthVarsSymm((uint *)pSes->pSpec,pSes->nSpecVars,(int)uVar3,(int)uVar12);
            if ((iVar9 != 0) &&
               ((piVar1 = pSes->pArrTimeProfile, piVar1 == (int *)0x0 ||
                (piVar1[uVar3] <= piVar1[uVar12])))) {
              if (pSes->fSatVerbose != 0) {
                printf("variables %d and %d are symmetric\n",uVar3 & 0xffffffff,uVar12 & 0xffffffff)
                ;
              }
              for (iVar9 = 0; iVar9 < pSes->nGates; iVar9 = iVar9 + 1) {
                local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,iVar9);
                for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
                  if (uVar3 != uVar18) {
                    pVVar6 = Vec_IntAlloc(0);
                    local_58 = uVar18;
                    iVar13 = Ses_ManSelectVar(pSes,iVar9,(int)uVar18,(int)uVar12);
                    iVar13 = Abc_Var2Lit(iVar13,1);
                    Vec_IntPush(pVVar6,iVar13);
                    for (iVar13 = 0; iVar13 != iVar9; iVar13 = iVar13 + 1) {
                      for (uVar12 = 1; (long)uVar12 < (long)pSes->nSpecVars + (long)iVar13;
                          uVar12 = uVar12 + 1) {
                        for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
                          if (uVar3 == uVar12 || uVar3 == uVar18) {
                            iVar9 = Ses_ManSelectVar(pSes,iVar13,(int)uVar18,(int)uVar12);
                            iVar9 = Abc_Var2Lit(iVar9,0);
                            Vec_IntPush(pVVar6,iVar9);
                          }
                        }
                      }
                      iVar9 = (uint)local_60;
                    }
                    sat_solver_addclause(pSes->pSat,pVVar6->pArray,pVVar6->pArray + pVVar6->nSize);
                    Vec_IntFree(pVVar6);
                    uVar12 = local_50;
                    uVar18 = local_58;
                  }
                }
              }
            }
          }
        }
      }
LAB_00283de5:
      aVar5 = Abc_Clock();
      pSes->timeInstance = pSes->timeInstance + (aVar5 - local_38);
      if ((int)uVar3 < local_44) goto LAB_00283e00;
      iVar9 = Ses_ManSolve(pSes);
      if (iVar9 == 1) {
        return 1;
      }
      if (iVar9 != 2) {
        return 2;
      }
    }
    pSes->fHitResLimit = 1;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int Ses_ManFindNetworkExact( Ses_Man_t * pSes, int nGates )
{
    int f, fSat;
    abctime timeStart;

    /* solve */
    timeStart = Abc_Clock();
    Vec_IntClear( pSes->vPolar );
    Vec_IntClear( pSes->vAssump );
    Ses_ManCreateVars( pSes, nGates );

    if ( pSes->nMaxDepth != -1 )
    {
        f = Ses_ManCreateDepthClauses( pSes );
        pSes->timeInstance += ( Abc_Clock() - timeStart );
        if ( !f ) return 2; /* proven UNSAT while creating clauses */
    }

    sat_solver_set_polarity( pSes->pSat, Vec_IntArray( pSes->vPolar ), Vec_IntSize( pSes->vPolar ) );

    /* first solve */
    fSat = Ses_ManSolve( pSes );
    if ( fSat == 0 )
        return 2; /* UNSAT, continue with next # of gates */
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    timeStart = Abc_Clock();
    f = Ses_ManCreateClauses( pSes );
    pSes->timeInstance += ( Abc_Clock() - timeStart );
    if ( !f ) return 2; /* proven UNSAT while creating clauses */

    fSat = Ses_ManSolve( pSes );
    if ( fSat == 1 )
        return 1;
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    return 2; /* UNSAT continue */
}